

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::DoDeadOutputStoreElimination
          (EliminateDeadOutputStoresPass *this)

{
  Analysis AVar1;
  pointer ppIVar2;
  DefUseManager *this_00;
  TypeManager *this_01;
  Module *pMVar3;
  DecorationManager *this_02;
  bool bVar4;
  code cVar5;
  ExecutionModel EVar6;
  Status SVar7;
  uint32_t uVar8;
  int iVar9;
  uint32_t id;
  Type *pTVar10;
  undefined4 extraout_var;
  long lVar11;
  IRContext *pIVar12;
  pointer ppIVar13;
  Instruction *var;
  Instruction *this_03;
  long *plVar14;
  Instruction **kinst;
  IRContext *pIVar15;
  pointer ppIVar16;
  Instruction *pIVar17;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  EVar6 = IRContext::GetStage((this->super_Pass).context_);
  SVar7 = Failure;
  if (EVar6 < ExecutionModelFragment) {
    ppIVar2 = (this->kill_list_).
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->kill_list_).
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppIVar2) {
      (this->kill_list_).
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppIVar2;
    }
    pIVar15 = (this->super_Pass).context_;
    AVar1 = pIVar15->valid_analyses_;
    pIVar12 = pIVar15;
    if ((AVar1 & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar15);
      pIVar12 = (this->super_Pass).context_;
      AVar1 = pIVar12->valid_analyses_;
    }
    this_00 = (pIVar15->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    pIVar15 = pIVar12;
    if (-1 < (short)AVar1) {
      IRContext::BuildTypeManager(pIVar12);
      pIVar15 = (this->super_Pass).context_;
      AVar1 = pIVar15->valid_analyses_;
    }
    this_01 = (pIVar12->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    pIVar12 = pIVar15;
    if ((AVar1 & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar15);
      pIVar12 = (this->super_Pass).context_;
    }
    pMVar3 = (pIVar12->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    this_03 = (pMVar3->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    pIVar17 = &(pMVar3->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    if (this_03 != pIVar17) {
      this_02 = (pIVar15->decoration_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                _M_head_impl;
      do {
        if (this_03->opcode_ == OpVariable) {
          uVar8 = 0;
          if (this_03->has_type_id_ == true) {
            uVar8 = Instruction::GetSingleWordOperand(this_03,0);
          }
          pTVar10 = analysis::TypeManager::GetType(this_01,uVar8);
          iVar9 = (*pTVar10->_vptr_Type[0x21])(pTVar10);
          if (*(int *)(CONCAT44(extraout_var,iVar9) + 0x30) == 3) {
            uVar8 = 0;
            if (this_03->has_result_id_ == true) {
              uVar8 = Instruction::GetSingleWordOperand(this_03,(uint)this_03->has_type_id_);
            }
            bVar4 = analysis::DecorationManager::HasDecoration(this_02,uVar8,0xb);
            cVar5 = (code)0x1;
            if (!bVar4) {
              plVar14 = *(long **)(CONCAT44(extraout_var,iVar9) + 0x28);
              lVar11 = (**(code **)(*plVar14 + 0xc0))(plVar14);
              if (lVar11 != 0) {
                plVar14 = *(long **)(lVar11 + 0x28);
              }
              pTVar10 = (Type *)(**(code **)(*plVar14 + 0xf0))(plVar14);
              if (pTVar10 == (Type *)0x0) {
                cVar5 = (code)0x0;
              }
              else {
                id = analysis::TypeManager::GetId(this_01,pTVar10);
                cVar5 = (code)analysis::DecorationManager::HasDecoration(this_02,id,0xb);
              }
            }
            local_50._8_8_ = 0;
            local_50._M_unused._M_object = operator_new(0x18);
            *(EliminateDeadOutputStoresPass **)local_50._M_unused._0_8_ = this;
            *(Instruction **)((long)local_50._M_unused._0_8_ + 8) = this_03;
            *(code *)((long)local_50._M_unused._0_8_ + 0x10) = cVar5;
            local_38 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:222:17)>
                       ::_M_invoke;
            local_40 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:222:17)>
                       ::_M_manager;
            analysis::DefUseManager::ForEachUser
                      (this_00,uVar8,(function<void_(spvtools::opt::Instruction_*)> *)&local_50);
            if (local_40 != (code *)0x0) {
              (*local_40)(&local_50,&local_50,__destroy_functor);
            }
          }
        }
        this_03 = (this_03->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (this_03 != pIVar17);
    }
    ppIVar13 = (this->kill_list_).
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppIVar2 = (this->kill_list_).
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar16 = ppIVar13;
    if (ppIVar13 != ppIVar2) {
      do {
        IRContext::KillInst((this->super_Pass).context_,*ppIVar13);
        ppIVar13 = ppIVar13 + 1;
      } while (ppIVar13 != ppIVar2);
      ppIVar13 = (this->kill_list_).
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar16 = (this->kill_list_).
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    SVar7 = ppIVar13 == ppIVar16 | SuccessWithChange;
  }
  return SVar7;
}

Assistant:

Pass::Status EliminateDeadOutputStoresPass::DoDeadOutputStoreElimination() {
  // Current implementation only supports vert, tesc, tese, geom shaders
  auto stage = context()->GetStage();
  if (stage != spv::ExecutionModel::Vertex &&
      stage != spv::ExecutionModel::TessellationControl &&
      stage != spv::ExecutionModel::TessellationEvaluation &&
      stage != spv::ExecutionModel::Geometry)
    return Status::Failure;
  InitializeElimination();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::DecorationManager* deco_mgr = context()->get_decoration_mgr();
  // Process all output variables
  for (auto& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    analysis::Type* var_type = type_mgr->GetType(var.type_id());
    analysis::Pointer* ptr_type = var_type->AsPointer();
    if (ptr_type->storage_class() != spv::StorageClass::Output) {
      continue;
    }
    // If builtin decoration on variable, process as builtin.
    auto var_id = var.result_id();
    bool is_builtin = false;
    if (deco_mgr->HasDecoration(var_id, uint32_t(spv::Decoration::BuiltIn))) {
      is_builtin = true;
    } else {
      // If interface block with builtin members, process as builtin.
      // Strip off outer array type if present.
      auto curr_type = ptr_type->pointee_type();
      auto arr_type = curr_type->AsArray();
      if (arr_type) curr_type = arr_type->element_type();
      auto str_type = curr_type->AsStruct();
      if (str_type) {
        auto str_type_id = type_mgr->GetId(str_type);
        if (deco_mgr->HasDecoration(str_type_id,
                                    uint32_t(spv::Decoration::BuiltIn)))
          is_builtin = true;
      }
    }
    // For each store or access chain using var, if dead builtin or all its
    // locations are dead, kill store or all access chain's stores
    def_use_mgr->ForEachUser(
        var_id, [this, &var, is_builtin](Instruction* user) {
          auto op = user->opcode();
          if (op == spv::Op::OpEntryPoint || op == spv::Op::OpName ||
              op == spv::Op::OpDecorate || user->IsNonSemanticInstruction())
            return;
          if (is_builtin)
            KillAllDeadStoresOfBuiltinRef(user, &var);
          else
            KillAllDeadStoresOfLocRef(user, &var);
        });
  }
  for (auto& kinst : kill_list_) context()->KillInst(kinst);

  return kill_list_.empty() ? Status::SuccessWithoutChange
                            : Status::SuccessWithChange;
}